

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

WriteBatch * __thiscall leveldb::DBImpl::BuildBatchGroup(DBImpl *this,Writer **last_writer)

{
  Writer *pWVar1;
  Writer *pWVar2;
  int iVar3;
  ulong uVar4;
  WriteBatch *b;
  _Map_pointer pppWVar5;
  WriteBatch *src;
  ulong uVar6;
  _Elt_pointer ppWVar7;
  _Elt_pointer ppWVar8;
  
  ppWVar8 = (this->writers_).
            super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->writers_).
      super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur == ppWVar8) {
    __assert_fail("!writers_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x4ee,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
  }
  pWVar1 = *ppWVar8;
  b = pWVar1->batch;
  if (b != (WriteBatch *)0x0) {
    uVar6 = (b->rep_)._M_string_length;
    uVar4 = 0x100000;
    if (uVar6 < 0x20001) {
      uVar4 = uVar6 + 0x20000;
    }
    *last_writer = pWVar1;
    ppWVar8 = (this->writers_).
              super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    pppWVar5 = (this->writers_).
               super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    ppWVar7 = (this->writers_).
              super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    if (ppWVar7 == ppWVar8) {
      ppWVar7 = pppWVar5[1];
      pppWVar5 = pppWVar5 + 1;
      ppWVar8 = ppWVar7 + 0x40;
    }
    if (ppWVar7 !=
        (this->writers_).
        super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur) {
      do {
        pWVar2 = *ppWVar7;
        if ((pWVar2->sync == true) && (pWVar1->sync != true)) {
          return b;
        }
        src = pWVar2->batch;
        if (src != (WriteBatch *)0x0) {
          uVar6 = uVar6 + (src->rep_)._M_string_length;
          if (uVar4 < uVar6) {
            return b;
          }
          if (b == pWVar1->batch) {
            b = this->tmp_batch_;
            iVar3 = WriteBatchInternal::Count(b);
            if (iVar3 != 0) {
              __assert_fail("WriteBatchInternal::Count(result) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                            ,0x512,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
            }
            WriteBatchInternal::Append(b,pWVar1->batch);
            src = pWVar2->batch;
          }
          WriteBatchInternal::Append(b,src);
        }
        *last_writer = pWVar2;
        ppWVar7 = ppWVar7 + 1;
        if (ppWVar7 == ppWVar8) {
          ppWVar7 = pppWVar5[1];
          pppWVar5 = pppWVar5 + 1;
          ppWVar8 = ppWVar7 + 0x40;
        }
      } while (ppWVar7 !=
               (this->writers_).
               super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur);
    }
    return b;
  }
  __assert_fail("result != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                ,0x4f1,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
}

Assistant:

WriteBatch* DBImpl::BuildBatchGroup(Writer** last_writer) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  Writer* first = writers_.front();
  WriteBatch* result = first->batch;
  assert(result != nullptr);

  size_t size = WriteBatchInternal::ByteSize(first->batch);

  // Allow the group to grow up to a maximum size, but if the
  // original write is small, limit the growth so we do not slow
  // down the small write too much.
  size_t max_size = 1 << 20;
  if (size <= (128 << 10)) {
    max_size = size + (128 << 10);
  }

  *last_writer = first;
  std::deque<Writer*>::iterator iter = writers_.begin();
  ++iter;  // Advance past "first"
  for (; iter != writers_.end(); ++iter) {
    Writer* w = *iter;
    if (w->sync && !first->sync) {
      // Do not include a sync write into a batch handled by a non-sync write.
      break;
    }

    if (w->batch != nullptr) {
      size += WriteBatchInternal::ByteSize(w->batch);
      if (size > max_size) {
        // Do not make batch too big
        break;
      }

      // Append to *result
      if (result == first->batch) {
        // Switch to temporary batch instead of disturbing caller's batch
        result = tmp_batch_;
        assert(WriteBatchInternal::Count(result) == 0);
        WriteBatchInternal::Append(result, first->batch);
      }
      WriteBatchInternal::Append(result, w->batch);
    }
    *last_writer = w;
  }
  return result;
}